

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread.c
# Opt level: O3

int test_start_n_thread(_func_void_void_ptr *func,TEST_ARGS *args)

{
  int64_t iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  pthread_t *__ptr;
  int *ptr;
  ulong uVar4;
  long lVar5;
  int64_t *piVar6;
  int iVar7;
  pthread_t *__newthread;
  int *piVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  lVar5 = args->num_threads;
  __ptr = (pthread_t *)malloc(lVar5 * 8);
  uVar9 = (uint)lVar5;
  ptr = (int *)calloc(1,(long)(int)uVar9 * 0x18);
  auVar2 = _DAT_001020d0;
  iVar7 = 1;
  if (0 < (int)uVar9) {
    iVar1 = args->N;
    uVar4 = (ulong)(uVar9 + 1 & 0xfffffffe);
    lVar5 = (ulong)(uVar9 & 0x7fffffff) - 1;
    auVar10._8_4_ = (int)lVar5;
    auVar10._0_8_ = lVar5;
    auVar10._12_4_ = (int)((ulong)lVar5 >> 0x20);
    piVar6 = (int64_t *)(ptr + 8);
    auVar10 = auVar10 ^ _DAT_001020d0;
    auVar11 = _DAT_001020c0;
    do {
      auVar12 = auVar11 ^ auVar2;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        piVar6[-3] = iVar1;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        *piVar6 = iVar1;
      }
      lVar5 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar5 + 2;
      piVar6 = piVar6 + 6;
      uVar4 = uVar4 - 2;
    } while (uVar4 != 0);
    if (0 < (int)uVar9) {
      uVar4 = (ulong)(uVar9 & 0x7fffffff);
      __newthread = __ptr;
      piVar8 = ptr;
      do {
        iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,(__start_routine *)func,piVar8);
        if (iVar3 != 0) {
          return 0;
        }
        piVar8 = piVar8 + 6;
        __newthread = __newthread + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      if (0 < (int)uVar9) {
        iVar7 = 1;
        uVar4 = 0;
        piVar8 = ptr;
        do {
          pthread_join(__ptr[uVar4],(void **)0x0);
          if (*piVar8 == 0) {
            iVar7 = 0;
          }
          uVar4 = uVar4 + 1;
          piVar8 = piVar8 + 6;
        } while ((uVar9 & 0x7fffffff) != uVar4);
      }
    }
  }
  free(__ptr);
  CRYPTO_free(ptr);
  return iVar7;
}

Assistant:

int test_start_n_thread(void (*func)(void *), TEST_ARGS *args)
{
    int i;
    int ret = GML_OK;
    int num_threads = args->num_threads;
    pthread_t *t;

    t = (pthread_t*)malloc(sizeof(pthread_t) * args->num_threads);
    TEST_ARGS *test_args = calloc(1, num_threads*sizeof(TEST_ARGS));

    /* copy arguments */
    for (int i = 0; i < num_threads; i++)
        test_args[i].N = args->N;

    /* start threads */
    for (i = 0; i < num_threads; i++)
        if (pthread_create(&t[i], NULL, (void*)func, (void*)&test_args[i]))
            return GML_ERROR;

    // sleep(5);

    // pthread_mutex_lock(&mut);
    // for(i = 0; i < n; i++)
    // {
    //     pthread_cond_signal(&cond[i]);
    // }
    // pthread_mutex_unlock(&mut);

    for (int i = 0; i < num_threads; i++) {
        pthread_join(t[i], NULL);
        if (test_args[i].ok == GML_ERROR)
            ret = GML_ERROR;
    }

    free(t);
    CRYPTO_free(test_args);
    return ret;
}